

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpGCTest_Collect_DeepRecursion_Test::TestBody(InterpGCTest_Collect_DeepRecursion_Test *this)

{
  Store *this_00;
  InterpGCTest_Collect_DeepRecursion_Test *pIVar1;
  long lVar2;
  char *pcVar3;
  Ptr prev_table;
  Ptr new_table;
  RefPtr<wabt::interp::Table> local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  undefined1 local_b8 [8];
  Store *local_b0;
  Index IStack_a8;
  AssertHelper local_a0;
  InterpGCTest_Collect_DeepRecursion_Test *local_98;
  TableType local_90;
  TableType local_60;
  
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_60.super_ExternType.kind = Table;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0024d180;
  local_60.super_ExternType._12_4_ = 0xffffffef;
  local_60._16_4_ = 0;
  local_60.limits.initial = 1;
  local_60.limits.max = 0xffffffff;
  local_60.limits.has_max = false;
  local_60.limits.is_shared = false;
  local_60.limits.is_64 = false;
  local_98 = this;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_d8,this_00,this_00,&local_60);
  lVar2 = 0x40;
  do {
    local_90.super_ExternType.kind = Table;
    local_90.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0024d180;
    local_90.super_ExternType._12_4_ = 0xffffffef;
    local_90._16_4_ = 0;
    local_90.limits.initial = 1;
    local_90.limits.max = 0xffffffff;
    local_90.limits.has_max = false;
    local_90.limits.is_shared = false;
    local_90.limits.is_64 = false;
    wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
              ((RefPtr<wabt::interp::Table> *)local_b8,this_00,this_00,&local_90);
    wabt::interp::Table::Set
              ((Table *)CONCAT71(local_b8._1_7_,local_b8[0]),this_00,0,
               (Ref)((local_d8.obj_)->super_Extern).super_Object.self_.index);
    if (local_d8.obj_ != (Table *)0x0) {
      wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
    }
    local_d8.obj_ = (Table *)CONCAT71(local_b8._1_7_,local_b8[0]);
    local_d8.store_ = local_b0;
    local_d8.root_index_ = IStack_a8;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  wabt::interp::Store::Collect(this_00);
  pIVar1 = local_98;
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x42;
  local_a0.data_ =
       (AssertHelperData *)
       (((long)*(pointer *)
                ((long)&(local_98->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                        ._M_impl + 8) -
         (long)(local_98->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) -
       (local_98->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b8,"table_count + 1","store_.object_count()",
             (unsigned_long *)&local_c0,(unsigned_long *)&local_a0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_b0 == (Store *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)&local_b0->features_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2d4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_b0 != (Store *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (local_d8.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
    local_d8.obj_ = (Table *)0x0;
    local_d8.store_ = (Store *)0x0;
    local_d8.root_index_ = 0;
  }
  wabt::interp::Store::Collect(this_00);
  local_a0.data_._0_4_ = 1;
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(pIVar1->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                        ._M_impl + 8) -
         (long)(pIVar1->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) -
       (pIVar1->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_b8,"1u","store_.object_count()",(uint *)&local_a0,
             (unsigned_long *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_b0 == (Store *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)&local_b0->features_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2da,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_b0 != (Store *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  if (local_d8.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_DeepRecursion) {
  const size_t table_count = 65;

  TableType tt = TableType{ValueType::ExternRef, Limits{1}};

  // Create a chain of tables, where each contains
  // a single reference to the next table.

  Table::Ptr prev_table = Table::New(store_, tt);

  for (size_t i = 1; i < table_count; i++) {
    Table::Ptr new_table = Table::New(store_, tt);

    new_table->Set(store_, 0, prev_table->self());

    prev_table.reset();
    prev_table = std::move(new_table);
  }

  store_.Collect();
  EXPECT_EQ(table_count + 1, store_.object_count());

  // Remove the last root, now all should be removed.
  prev_table.reset();

  store_.Collect();
  EXPECT_EQ(1u, store_.object_count());
}